

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O0

void __thiscall binlog::EventStream::readClockSync(EventStream *this,Range range)

{
  ClockSync *in_RDI;
  ClockSync clockSync;
  ClockSync *out;
  ClockSync local_58;
  
  out = &local_58;
  ClockSync::ClockSync((ClockSync *)0x1222ab);
  mserialize::deserialize<binlog::ClockSync,binlog::Range>(out,(Range *)in_RDI);
  ClockSync::operator=(out,in_RDI);
  ClockSync::~ClockSync((ClockSync *)0x1222d8);
  return;
}

Assistant:

void EventStream::readClockSync(Range range)
{
  // Make sure _clockSync is updated only if deserialize does not throw
  ClockSync clockSync;
  mserialize::deserialize(clockSync, range);
  _clockSync = std::move(clockSync);
}